

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O0

void __thiscall ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,VariableRead *e)

{
  bool bVar1;
  int iVar2;
  Block *pBVar3;
  string *psVar4;
  RuntimeException *this_00;
  Block *pBVar5;
  allocator local_e9;
  string local_e8;
  undefined1 local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  allocator local_79;
  string local_78;
  Block *local_58;
  Block *variable;
  Block *local_40;
  Block *target_object;
  string field_name;
  VariableRead *e_local;
  DefaultEvaluator *this_local;
  
  field_name.field_2._8_8_ = e;
  std::__cxx11::string::string((string *)&target_object);
  pBVar3 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
  psVar4 = parser::element::VariableRead::get_name_abi_cxx11_
                     ((VariableRead *)field_name.field_2._8_8_);
  local_40 = navigate_object_tree(pBVar3,psVar4,(string *)&target_object);
  pBVar3 = parser::element::Block::get_variable(local_40,(string *)&target_object);
  local_58 = pBVar3;
  if (pBVar3 != (Block *)0x0) {
    pBVar5 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
    (*(pBVar3->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[5])
              (pBVar3,pBVar5);
    (*(local_58->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[2])
              (local_58,this);
    pBVar3 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
    bVar1 = parser::element::Block::is_echoing(pBVar3);
    if ((bVar1) && ((is_echoing_disabled & 1U) == 0)) {
      pBVar3 = parser::element::ASTElement::get_parent((ASTElement *)field_name.field_2._8_8_);
      iVar2 = parser::element::VariableRead::get_trailing_spaces
                        ((VariableRead *)field_name.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_e8,(long)iVar2,' ',&local_e9);
      parser::element::Block::__add_output_segment(pBVar3,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_e9);
    }
    std::__cxx11::string::~string((string *)&target_object);
    return;
  }
  local_c1 = 1;
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_78,"TODO",&local_79);
  psVar4 = parser::element::VariableRead::get_name_abi_cxx11_
                     ((VariableRead *)field_name.field_2._8_8_);
  std::operator+(&local_c0,"Variable \"",psVar4);
  std::operator+(&local_a0,&local_c0,"\" has not been declared!");
  exception::RuntimeException::RuntimeException(this_00,0,&local_78,&local_a0);
  local_c1 = 0;
  __cxa_throw(this_00,&exception::RuntimeException::typeinfo,
              exception::RuntimeException::~RuntimeException);
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::VariableRead *e) {
    // Obtain the referenced object by navigating the name structure
    std::string field_name;
    auto target_object { navigate_object_tree(e->get_parent(), e->get_name(), field_name) };

    auto variable {target_object->get_variable(field_name)};

    if (!variable) {
        // TODO: add information of line number and origin
        throw ninx::evaluator::exception::RuntimeException(0, "TODO", "Variable \""+e->get_name()+"\" has not been declared!");
    }

    variable->__set_output_block(e->get_parent());
    variable->accept(this);

    // Recover the trailing spaces
    if (e->get_parent()->is_echoing() && !is_echoing_disabled) {
        e->get_parent()->__add_output_segment(std::string(e->get_trailing_spaces(), ' '));
    }
}